

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::deleteRboAttachedToBoundFboTest(TestContext *testCtx,Context *ctx)

{
  deUint32 rbo;
  undefined4 local_1c;
  
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  local_1c = 1;
  (*ctx->_vptr_Context[0xc])(ctx,0x8d41,1);
  (*ctx->_vptr_Context[0x20])(ctx,0x8d40,0x8d20,0x8d41,1);
  checkFboAttachmentParam(testCtx,ctx,0x8d20,0x8cd0,0x8d41);
  checkFboAttachmentParam(testCtx,ctx,0x8d20,0x8cd1,1);
  (*ctx->_vptr_Context[0xe])(ctx,1,&local_1c);
  checkFboAttachmentParam(testCtx,ctx,0x8d20,0x8cd0,0);
  return;
}

Assistant:

static void deleteRboAttachedToBoundFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 rbo = 1;
	ctx.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, rbo);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, rbo);

	ctx.deleteRenderbuffers(1, &rbo);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);
}